

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall RPCResults::RPCResults(RPCResults *this,RPCResult *result)

{
  initializer_list<RPCResult> __l;
  size_type in_RDI;
  long in_FS_OFFSET;
  RPCResult *in_stack_fffffffffffffed8;
  RPCResult *in_stack_ffffffffffffff10;
  byte *pbVar1;
  RPCResult *in_stack_ffffffffffffff18;
  long *plVar2;
  iterator pRVar3;
  RPCResult local_91;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  RPCResult::RPCResult(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  pRVar3 = &local_91;
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)in_stack_fffffffffffffed8);
  __l._M_len = in_RDI;
  __l._M_array = pRVar3;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffff18,__l,
             (allocator_type *)in_stack_ffffffffffffff10);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)in_stack_fffffffffffffed8);
  pbVar1 = (byte *)((long)&local_91.m_type + 1);
  plVar2 = &local_8;
  do {
    plVar2 = plVar2 + -0x11;
    RPCResult::~RPCResult(in_stack_fffffffffffffed8);
  } while ((byte *)plVar2 != pbVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RPCResults(RPCResult result)
        : m_results{{result}}
    {
    }